

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLD3LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t extraout_RDX;
  uint64_t Address_03;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t uVar3;
  uint64_t Address_04;
  uint64_t Address_05;
  uint RegNo;
  int iVar4;
  uint RegNo_00;
  uint RegNo_01;
  uint uVar5;
  DecodeStatus local_3c;
  
  switch(Insn >> 10 & 3) {
  case 0:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar5 = Insn >> 5 & 7;
    iVar4 = 1;
    goto LAB_00150981;
  case 1:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar5 = Insn >> 6 & 3;
    uVar1 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x30) != 0) {
      return MCDisassembler_Fail;
    }
    uVar5 = Insn >> 7 & 1;
    uVar1 = Insn & 0x40;
    break;
  case 3:
    return MCDisassembler_Fail;
  }
  iVar4 = 2 - (uint)(uVar1 == 0);
LAB_00150981:
  uVar1 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  local_3c = DecodeDPRRegisterClass(Inst,uVar1,Address,&switchD_00150921::switchdataD_001c9f70);
  Decoder_00 = (void *)(ulong)(local_3c | 2);
  if ((local_3c | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  DVar2 = DecodeDPRRegisterClass(Inst,uVar1 + iVar4,Address_00,Decoder_00);
  if (DVar2 != MCDisassembler_Success) {
    if (DVar2 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    local_3c = MCDisassembler_SoftFail;
  }
  RegNo = uVar1 + iVar4 * 2;
  DVar2 = DecodeDPRRegisterClass(Inst,RegNo,Address_01,Decoder_00);
  if (DVar2 != MCDisassembler_Success) {
    if (DVar2 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    local_3c = MCDisassembler_SoftFail;
  }
  RegNo_00 = Insn >> 0x10 & 0xf;
  RegNo_01 = Insn & 0xf;
  uVar3 = Address_02;
  if ((RegNo_01 != 0xf) &&
     (DVar2 = DecodeGPRRegisterClass(Inst,RegNo_00,Address_02,Decoder_00), uVar3 = extraout_RDX,
     DVar2 != MCDisassembler_Success)) {
    if (DVar2 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    local_3c = MCDisassembler_SoftFail;
  }
  DVar2 = DecodeGPRRegisterClass(Inst,RegNo_00,uVar3,Decoder_00);
  if (DVar2 != MCDisassembler_Success) {
    if (DVar2 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    local_3c = MCDisassembler_SoftFail;
  }
  MCOperand_CreateImm0(Inst,0);
  uVar3 = Address_03;
  if (RegNo_01 != 0xf) {
    if (RegNo_01 == 0xd) {
      MCOperand_CreateReg0(Inst,0);
      uVar3 = extraout_RDX_00;
    }
    else {
      DVar2 = DecodeGPRRegisterClass(Inst,RegNo_01,Address_03,Decoder_00);
      uVar3 = extraout_RDX_01;
      if (DVar2 != MCDisassembler_Success) {
        if (DVar2 != MCDisassembler_SoftFail) {
          return MCDisassembler_Fail;
        }
        local_3c = MCDisassembler_SoftFail;
      }
    }
  }
  DVar2 = DecodeDPRRegisterClass(Inst,uVar1,uVar3,Decoder_00);
  if (DVar2 == MCDisassembler_Success) {
LAB_00150aad:
    DVar2 = DecodeDPRRegisterClass(Inst,uVar1 + iVar4,Address_04,Decoder_00);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_00150afd;
      local_3c = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeDPRRegisterClass(Inst,RegNo,Address_05,Decoder_00);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar5);
  }
  else {
    if (DVar2 == MCDisassembler_SoftFail) {
      local_3c = MCDisassembler_SoftFail;
      goto LAB_00150aad;
    }
LAB_00150afd:
    local_3c = MCDisassembler_Fail;
  }
  return local_3c;
}

Assistant:

static DecodeStatus DecodeVLD3LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 4, 2))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}